

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_global_trace(char *config)

{
  CURLcode CVar1;
  CURLcode result;
  char *config_local;
  
  curl_simple_lock_lock(&s_lock);
  CVar1 = Curl_trc_opt(config);
  curl_simple_lock_unlock(&s_lock);
  return CVar1;
}

Assistant:

CURLcode curl_global_trace(const char *config)
{
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  CURLcode result;
  global_init_lock();

  result = Curl_trc_opt(config);

  global_init_unlock();

  return result;
#else
  (void)config;
  return CURLE_OK;
#endif
}